

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

rnndelem * trydelem(rnndb *db,char *file,xmlNode *node)

{
  xmlChar *pxVar1;
  xmlAttr *pxVar2;
  rnndb *prVar3;
  rnnetype rVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  rnndelem **__ptr;
  long lVar9;
  rnndelem *prVar10;
  uint64_t uVar11;
  char *pcVar12;
  xmlNode *node_00;
  xmlNode *node_01;
  _xmlAttr **pp_Var13;
  _xmlNode **pp_Var14;
  rnndelem *local_60;
  int *local_50;
  
  pxVar1 = node->name;
  iVar6 = strcmp((char *)pxVar1,"use-group");
  if (iVar6 == 0) {
    prVar10 = (rnndelem *)calloc(0x110,1);
    prVar10->file = file;
    prVar10->type = RNN_ETYPE_USE_GROUP;
    pcVar12 = (char *)0x0;
    pp_Var13 = &node->properties;
    while (pxVar2 = *pp_Var13, pxVar2 != (xmlAttr *)0x0) {
      pxVar1 = pxVar2->name;
      iVar6 = strcmp((char *)pxVar1,"name");
      if (iVar6 == 0) {
        pcVar12 = getattrib(db,file,(uint)node->line,pxVar2);
        pcVar12 = strdup(pcVar12);
        prVar10->name = pcVar12;
      }
      else {
        fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for %s\n",file,(ulong)node->line,pxVar1,
                node->name);
        db->estatus = 1;
      }
      pp_Var13 = &pxVar2->next;
    }
    if (pcVar12 != (char *)0x0) {
      return prVar10;
    }
    fprintf(_stderr,"%s:%d: nameless use-group\n",file,(ulong)node->line);
    free(prVar10);
LAB_001058a0:
    local_50 = &db->estatus;
    *local_50 = 1;
LAB_001058ab:
    local_60 = (rnndelem *)0x0;
  }
  else {
    iVar6 = strcmp((char *)pxVar1,"stripe");
    if (iVar6 == 0) {
      rVar4 = RNN_ETYPE_STRIPE;
    }
    else {
      iVar7 = strcmp((char *)pxVar1,"array");
      if (iVar7 != 0) {
        iVar6 = strcmp((char *)pxVar1,"reg8");
        if (iVar6 == 0) {
          iVar6 = 8;
LAB_0010553e:
          prVar10 = (rnndelem *)calloc(0x110,1);
          prVar10->file = file;
          prVar10->width = iVar6;
          prVar10->length = 1;
          prVar10->access = RNN_ACCESS_RW;
          pp_Var13 = &node->properties;
          while (pxVar2 = *pp_Var13, pxVar2 != (xmlAttr *)0x0) {
            pxVar1 = pxVar2->name;
            iVar6 = strcmp((char *)pxVar1,"name");
            if (iVar6 == 0) {
              pcVar12 = getattrib(db,file,(uint)node->line,pxVar2);
              pcVar12 = strdup(pcVar12);
              prVar10->name = pcVar12;
            }
            else {
              iVar6 = strcmp((char *)pxVar1,"offset");
              if (iVar6 == 0) {
                uVar11 = getnumattrib(db,file,(uint)node->line,pxVar2);
                prVar10->offset = uVar11;
              }
              else {
                iVar6 = strcmp((char *)pxVar1,"length");
                if (iVar6 == 0) {
                  uVar11 = getnumattrib(db,file,(uint)node->line,pxVar2);
                  prVar10->length = uVar11;
                }
                else {
                  iVar6 = strcmp((char *)pxVar1,"stride");
                  if (iVar6 == 0) {
                    uVar11 = getnumattrib(db,file,(uint)node->line,pxVar2);
                    prVar10->stride = uVar11;
                  }
                  else {
                    iVar6 = strcmp((char *)pxVar1,"varset");
                    if (iVar6 == 0) {
                      pcVar12 = getattrib(db,file,(uint)node->line,pxVar2);
                      pcVar12 = strdup(pcVar12);
                      (prVar10->varinfo).varsetstr = pcVar12;
                    }
                    else {
                      iVar6 = strcmp((char *)pxVar1,"variants");
                      if (iVar6 == 0) {
                        pcVar12 = getattrib(db,file,(uint)node->line,pxVar2);
                        pcVar12 = strdup(pcVar12);
                        (prVar10->varinfo).variantsstr = pcVar12;
                      }
                      else {
                        iVar6 = strcmp((char *)pxVar1,"access");
                        if (iVar6 == 0) {
                          pcVar12 = getattrib(db,file,(uint)node->line,pxVar2);
                          if (*pcVar12 == 'w') {
                            if (pcVar12[1] != '\0') goto LAB_001057cc;
                            prVar10->access = RNN_ACCESS_W;
                          }
                          else if (*pcVar12 == 'r') {
                            if (pcVar12[1] == '\0') {
                              prVar10->access = RNN_ACCESS_R;
                            }
                            else {
                              if ((pcVar12[1] != 'w') || (pcVar12[2] != '\0')) goto LAB_001057cc;
                              prVar10->access = RNN_ACCESS_RW;
                            }
                          }
                          else {
LAB_001057cc:
                            fprintf(_stderr,"%s:%d: wrong access type \"%s\" for register\n",file,
                                    (ulong)node->line,pcVar12);
                          }
                        }
                        else {
                          iVar6 = trytypeattr(db,file,node,pxVar2,&prVar10->typeinfo);
                          if (iVar6 == 0) {
                            fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for register\n",file,
                                    (ulong)node->line,pxVar2->name);
                            db->estatus = 1;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            pp_Var13 = &pxVar2->next;
          }
          pp_Var14 = &node->children;
          while (prVar3 = (rnndb *)*pp_Var14, prVar3 != (rnndb *)0x0) {
            if ((((*(int *)&(prVar3->copyright).license == 1) &&
                 (iVar6 = trytypetag(db,file,(xmlNode *)prVar3,&prVar10->typeinfo), iVar6 == 0)) &&
                (pcVar12 = file, iVar6 = trytop(db,file,(xmlNode *)prVar3), iVar6 == 0)) &&
               (iVar6 = trydoc(prVar3,pcVar12,node_01), iVar6 == 0)) {
              fprintf(_stderr,"%s:%d: wrong tag in %s: <%s>\n",file,(ulong)*(ushort *)&prVar3->files
                      ,node->name,(prVar3->copyright).authors);
              db->estatus = 1;
            }
            pp_Var14 = (_xmlNode **)&prVar3->bitsets;
          }
          if (prVar10->name != (char *)0x0) {
            return prVar10;
          }
          fprintf(_stderr,"%s:%d: nameless register\n",file,(ulong)node->line);
          goto LAB_001058a0;
        }
        iVar6 = strcmp((char *)pxVar1,"reg16");
        if (iVar6 == 0) {
          iVar6 = 0x10;
          goto LAB_0010553e;
        }
        iVar6 = strcmp((char *)pxVar1,"reg32");
        if (iVar6 == 0) {
          iVar6 = 0x20;
          goto LAB_0010553e;
        }
        iVar6 = strcmp((char *)pxVar1,"reg64");
        if (iVar6 == 0) {
          iVar6 = 0x40;
          goto LAB_0010553e;
        }
        goto LAB_001058ab;
      }
      rVar4 = RNN_ETYPE_ARRAY;
    }
    local_60 = (rnndelem *)calloc(0x110,1);
    local_60->type = rVar4;
    local_60->length = 1;
    local_60->file = file;
    pp_Var13 = &node->properties;
    while (pxVar2 = *pp_Var13, pxVar2 != (xmlAttr *)0x0) {
      pxVar1 = pxVar2->name;
      iVar7 = strcmp((char *)pxVar1,"name");
      if (iVar7 == 0) {
        pcVar12 = getattrib(db,file,(uint)node->line,pxVar2);
        pcVar12 = strdup(pcVar12);
        local_60->name = pcVar12;
      }
      else {
        iVar7 = strcmp((char *)pxVar1,"offset");
        if (iVar7 == 0) {
          uVar11 = getnumattrib(db,file,(uint)node->line,pxVar2);
          local_60->offset = uVar11;
        }
        else {
          iVar7 = strcmp((char *)pxVar1,"length");
          if (iVar7 == 0) {
            uVar11 = getnumattrib(db,file,(uint)node->line,pxVar2);
            local_60->length = uVar11;
          }
          else {
            iVar7 = strcmp((char *)pxVar1,"stride");
            if (iVar7 == 0) {
              uVar11 = getnumattrib(db,file,(uint)node->line,pxVar2);
              local_60->stride = uVar11;
            }
            else {
              iVar7 = strcmp((char *)pxVar1,"prefix");
              if (iVar7 == 0) {
                pcVar12 = getattrib(db,file,(uint)node->line,pxVar2);
                pcVar12 = strdup(pcVar12);
                (local_60->varinfo).prefixstr = pcVar12;
              }
              else {
                iVar7 = strcmp((char *)pxVar1,"varset");
                if (iVar7 == 0) {
                  pcVar12 = getattrib(db,file,(uint)node->line,pxVar2);
                  pcVar12 = strdup(pcVar12);
                  (local_60->varinfo).varsetstr = pcVar12;
                }
                else {
                  iVar7 = strcmp((char *)pxVar1,"variants");
                  if (iVar7 == 0) {
                    pcVar12 = getattrib(db,file,(uint)node->line,pxVar2);
                    pcVar12 = strdup(pcVar12);
                    (local_60->varinfo).variantsstr = pcVar12;
                  }
                  else {
                    fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for %s\n",file,(ulong)node->line,
                            pxVar1,node->name);
                    db->estatus = 1;
                  }
                }
              }
            }
          }
        }
      }
      pp_Var13 = &pxVar2->next;
    }
    __ptr = (rnndelem **)0x0;
    iVar5 = 0;
    iVar7 = 0;
    pp_Var14 = &node->children;
    while (prVar3 = (rnndb *)*pp_Var14, prVar3 != (rnndb *)0x0) {
      if (*(int *)&(prVar3->copyright).license == 1) {
        prVar10 = trydelem(db,file,(xmlNode *)prVar3);
        if (prVar10 == (rnndelem *)0x0) {
          pcVar12 = file;
          iVar8 = trytop(db,file,(xmlNode *)prVar3);
          if ((iVar8 == 0) && (iVar8 = trydoc(prVar3,pcVar12,node_00), iVar8 == 0)) {
            fprintf(_stderr,"%s:%d: wrong tag in %s: <%s>\n",file,(ulong)*(ushort *)&prVar3->files,
                    node->name,(prVar3->copyright).authors);
            db->estatus = 1;
          }
        }
        else {
          if (iVar5 <= iVar7) {
            iVar8 = iVar5 * 2;
            if (iVar5 == 0) {
              iVar8 = 0x10;
            }
            local_60->subelemsmax = iVar8;
            __ptr = (rnndelem **)realloc(__ptr,(long)iVar8 << 3);
            local_60->subelems = __ptr;
            iVar5 = iVar8;
          }
          lVar9 = (long)iVar7;
          iVar7 = iVar7 + 1;
          local_60->subelemsnum = iVar7;
          __ptr[lVar9] = prVar10;
        }
      }
      pp_Var14 = (_xmlNode **)&prVar3->bitsets;
    }
    if ((iVar6 != 0) && (local_60->stride == 0)) {
      fprintf(_stderr,"%s: Array %s\'s stride is undefined. Aborting.\n",file,local_60->name);
      exit(-1);
    }
  }
  return local_60;
}

Assistant:

static struct rnndelem *trydelem(struct rnndb *db, char *file, xmlNode *node) {
	if (!strcmp(node->name, "use-group")) {
		struct rnndelem *res = calloc(sizeof *res, 1);
		res->file = file;
		res->type = RNN_ETYPE_USE_GROUP;
		xmlAttr *attr = node->properties;
		while (attr) {
			if (!strcmp(attr->name, "name")) {
				res->name = strdup(getattrib(db, file, node->line, attr));
			} else {
				fprintf (stderr, "%s:%d: wrong attribute \"%s\" for %s\n", file, node->line, attr->name, node->name);
				db->estatus = 1;
			}
			attr = attr->next;
		}
		if (!res->name) {
			fprintf (stderr, "%s:%d: nameless use-group\n", file, node->line);
			free(res);
			db->estatus = 1;
			return 0;
		}
		return res;
	} else if (!strcmp(node->name, "stripe") || !strcmp(node->name, "array")) {
		struct rnndelem *res = calloc(sizeof *res, 1);
		res->type = (strcmp(node->name, "stripe")?RNN_ETYPE_ARRAY:RNN_ETYPE_STRIPE);
		res->length = 1;
		res->file = file;
		xmlAttr *attr = node->properties;
		while (attr) {
			if (!strcmp(attr->name, "name")) {
				res->name = strdup(getattrib(db, file, node->line, attr));
			} else if (!strcmp(attr->name, "offset")) {
				res->offset = getnumattrib(db, file, node->line, attr);
			} else if (!strcmp(attr->name, "length")) {
				res->length = getnumattrib(db, file, node->line, attr);
			} else if (!strcmp(attr->name, "stride")) {
				res->stride = getnumattrib(db, file, node->line, attr);
			} else if (!strcmp(attr->name, "prefix")) {
				res->varinfo.prefixstr = strdup(getattrib(db, file, node->line, attr));
			} else if (!strcmp(attr->name, "varset")) {
				res->varinfo.varsetstr = strdup(getattrib(db, file, node->line, attr));
			} else if (!strcmp(attr->name, "variants")) {
				res->varinfo.variantsstr = strdup(getattrib(db, file, node->line, attr));
			} else {
				fprintf (stderr, "%s:%d: wrong attribute \"%s\" for %s\n", file, node->line, attr->name, node->name);
				db->estatus = 1;
			}
			attr = attr->next;
		}
		xmlNode *chain = node->children;
		while (chain) {
			struct rnndelem *delem;
			if (chain->type != XML_ELEMENT_NODE) {
			} else if ((delem = trydelem(db, file, chain))) {
				ADDARRAY(res->subelems, delem);
			} else if (!trytop(db, file, chain) && !trydoc(db, file, chain)) {
				fprintf (stderr, "%s:%d: wrong tag in %s: <%s>\n", file, chain->line, node->name, chain->name);
				db->estatus = 1;
			}
			chain = chain->next;
		}

		/* Sanity checking */
		if (res->type == RNN_ETYPE_ARRAY && res->stride == 0) {
			fprintf(stderr, "%s: Array %s's stride is undefined. Aborting.\n", file, res->name);
			exit(-1);
		}
		return res;

	}
	int width;
	if (!strcmp(node->name, "reg8"))
		width = 8;
	else if (!strcmp(node->name, "reg16"))
		width = 16;
	else if (!strcmp(node->name, "reg32"))
		width = 32;
	else if (!strcmp(node->name, "reg64"))
		width = 64;
	else
		return 0;
	struct rnndelem *res = calloc(sizeof *res, 1);
	res->file = file;
	res->type = RNN_ETYPE_REG;
	res->width = width;
	res->length = 1;
	res->access = RNN_ACCESS_RW;
	xmlAttr *attr = node->properties;
	while (attr) {
		if (!strcmp(attr->name, "name")) {
			res->name = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "offset")) {
			res->offset = getnumattrib(db, file, node->line, attr);
		} else if (!strcmp(attr->name, "length")) {
			res->length = getnumattrib(db, file, node->line, attr);
		} else if (!strcmp(attr->name, "stride")) {
			res->stride = getnumattrib(db, file, node->line, attr);
		} else if (!strcmp(attr->name, "varset")) {
			res->varinfo.varsetstr = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "variants")) {
			res->varinfo.variantsstr = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "access")) {
			char *str = getattrib(db, file, node->line, attr);
			if (!strcmp(str, "r"))
				res->access = RNN_ACCESS_R;
			else if (!strcmp(str, "w"))
				res->access = RNN_ACCESS_W;
			else if (!strcmp(str, "rw"))
				res->access = RNN_ACCESS_RW;
			else
				fprintf (stderr, "%s:%d: wrong access type \"%s\" for register\n", file, node->line, str);
		} else if (!trytypeattr(db, file, node, attr, &res->typeinfo)) {
			fprintf (stderr, "%s:%d: wrong attribute \"%s\" for register\n", file, node->line, attr->name);
			db->estatus = 1;
		}
		attr = attr->next;
	}
	xmlNode *chain = node->children;
	while (chain) {
		if (chain->type != XML_ELEMENT_NODE) {
		} else if (!trytypetag(db, file, chain, &res->typeinfo) && !trytop(db, file, chain) && !trydoc(db, file, chain)) {
			fprintf (stderr, "%s:%d: wrong tag in %s: <%s>\n", file, chain->line, node->name, chain->name);
			db->estatus = 1;
		}
		chain = chain->next;
	}
	if (!res->name) {
		fprintf (stderr, "%s:%d: nameless register\n", file, node->line);
		db->estatus = 1;
		return 0;
	} else {
	}
	return res;
}